

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void runN(Benchmark *b,int n,int siz)

{
  Benchmark *b_00;
  char *__s;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar6;
  int siz_00;
  timespec *ptVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  timespec tp;
  StringPiece SStack_148;
  RE2 RStack_138;
  ulong uStack_58;
  timespec local_28;
  size_t sVar5;
  
  ptVar7 = &local_28;
  bytes = 0;
  ns = 0;
  iVar2 = clock_gettime(0,&local_28);
  if (iVar2 < 0) {
    t0 = -1;
  }
  else {
    t0 = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
  }
  if (b->fn == (_func_void_int *)0x0) {
    if (b->fnr == (_func_void_int_int *)0x0) {
      runN();
      if (0 < nbenchmarks) {
        iVar2 = (int)b;
        lVar9 = 0;
        uStack_58 = (ulong)(uint)n;
        do {
          b_00 = benchmarks[lVar9];
          if (iVar2 == 1) {
LAB_0012b213:
            iVar3 = b_00->threadlo;
            if (b_00->threadlo <= b_00->threadhi) {
              do {
                siz_00 = b_00->lo;
                iVar4 = b_00->hi;
                if (iVar4 < 2) {
                  iVar4 = 1;
                }
                if (siz_00 <= iVar4) {
                  if (siz_00 < 2) {
                    siz_00 = 1;
                  }
                  do {
                    RunBench(b_00,iVar3,siz_00);
                    siz_00 = siz_00 * 2;
                    iVar4 = b_00->hi;
                    if (iVar4 < 2) {
                      iVar4 = 1;
                    }
                  } while (siz_00 <= iVar4);
                }
                bVar10 = iVar3 < b_00->threadhi;
                iVar3 = iVar3 + 1;
              } while (bVar10);
            }
          }
          else {
            bVar10 = 1 < iVar2;
            if (1 < iVar2) {
              __s = b_00->name;
              bVar10 = true;
              uVar8 = 2;
              do {
                if (__s == (char *)0x0) {
                  iVar3 = 0;
                }
                else {
                  sVar5 = strlen(__s);
                  iVar3 = (int)sVar5;
                }
                re2::RE2::RE2(&RStack_138,*(char **)((long)ptVar7 + uVar8 * 8 + -8));
                SStack_148.ptr_ = __s;
                SStack_148.length_ = iVar3;
                bVar1 = re2::RE2::PartialMatchN(&SStack_148,&RStack_138,(Arg **)0x0,0);
                re2::RE2::~RE2(&RStack_138);
                if (bVar1) break;
                bVar10 = uVar8 < ((ulong)b & 0xffffffff);
                lVar6 = (1 - ((ulong)b & 0xffffffff)) + uVar8;
                uVar8 = uVar8 + 1;
              } while (lVar6 != 1);
            }
            if (bVar10) goto LAB_0012b213;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < nbenchmarks);
      }
      return;
    }
    (*b->fnr)(n,siz);
  }
  else {
    (*b->fn)(n);
  }
  if (t0 != 0) {
    iVar2 = clock_gettime(0,&local_28);
    if (iVar2 < 0) {
      local_28.tv_nsec = -1;
    }
    else {
      local_28.tv_nsec = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
    }
    ns = ns + (local_28.tv_nsec - t0);
  }
  return;
}

Assistant:

static void runN(Benchmark *b, int n, int siz) {
	bytes = 0;
	items = 0;
	ns = 0;
	t0 = nsec();
	if(b->fn)
		b->fn(n);
	else if(b->fnr)
		b->fnr(n, siz);
	else {
		fprintf(stderr, "%s: missing function\n", b->name);
		exit(2);
	}
	if(t0 != 0)
		ns += nsec() - t0;
}